

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

SigningResult __thiscall
wallet::DescriptorScriptPubKeyMan::SignMessage
          (DescriptorScriptPubKeyMan *this,string *message,PKHash *pkhash,string *str_sig)

{
  undefined1 this_00 [8];
  bool bVar1;
  SigningResult SVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> keys;
  CKey key;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 local_60;
  undefined1 local_58 [28];
  uint local_3c;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_98 = *(undefined4 *)
              ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10
              );
  local_a8._0_8_ =
       *(undefined8 *)(pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
  ;
  local_a8._8_8_ =
       *(undefined8 *)
        ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 8);
  local_60 = 2;
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)(local_b0 + 8));
  GetSigningProvider((DescriptorScriptPubKeyMan *)local_b0,(CScript *)this,SUB81(local_58,0));
  if (0x1c < local_3c) {
    free((void *)local_58._0_8_);
    local_58._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(local_b0 + 8));
  this_00 = local_b0;
  if (local_b0 == (undefined1  [8])0x0) {
    SVar2 = PRIVATE_KEY_NOT_AVAILABLE;
  }
  else {
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_58._8_8_ = (array<unsigned_char,_32UL> *)0x0;
    ToKeyID((CKeyID *)(local_b0 + 8),pkhash);
    bVar1 = FlatSigningProvider::GetKey
                      ((FlatSigningProvider *)this_00,(CKeyID *)(local_b0 + 8),(CKey *)local_58);
    SVar2 = PRIVATE_KEY_NOT_AVAILABLE;
    if (bVar1) {
      bVar1 = MessageSign((CKey *)local_58,message,str_sig);
      SVar2 = (uint)!bVar1 * 2;
    }
    if ((array<unsigned_char,_32UL> *)local_58._8_8_ != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_58 + 8),
                 (array<unsigned_char,_32UL> *)local_58._8_8_);
    }
  }
  if (local_b0 != (undefined1  [8])0x0) {
    std::default_delete<FlatSigningProvider>::operator()
              ((default_delete<FlatSigningProvider> *)local_b0,(FlatSigningProvider *)local_b0);
  }
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

SigningResult DescriptorScriptPubKeyMan::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    std::unique_ptr<FlatSigningProvider> keys = GetSigningProvider(GetScriptForDestination(pkhash), true);
    if (!keys) {
        return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
    }

    CKey key;
    if (!keys->GetKey(ToKeyID(pkhash), key)) {
        return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
    }

    if (!MessageSign(key, message, str_sig)) {
        return SigningResult::SIGNING_FAILED;
    }
    return SigningResult::OK;
}